

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O1

void VP8LDoFillBitWindow(VP8LBitReader *br)

{
  size_t sVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  
  sVar1 = br->pos;
  if (sVar1 + 8 < br->len) {
    uVar5 = br->val;
    br->val = uVar5 >> 0x20;
    br->bit_pos = br->bit_pos + -0x20;
    br->val = (ulong)*(uint *)(br->buf + sVar1) << 0x20 | uVar5 >> 0x20;
    br->pos = sVar1 + 4;
    return;
  }
  bVar3 = true;
  if (7 < br->bit_pos) {
    uVar5 = br->pos;
    iVar4 = br->bit_pos;
    do {
      iVar6 = iVar4;
      if (br->len <= uVar5) break;
      uVar2 = br->val;
      br->val = uVar2 >> 8;
      br->val = (ulong)br->buf[uVar5] << 0x38 | uVar2 >> 8;
      uVar5 = uVar5 + 1;
      br->pos = uVar5;
      iVar6 = iVar4 + -8;
      br->bit_pos = iVar6;
      bVar3 = 0xf < iVar4;
      iVar4 = iVar6;
    } while (bVar3);
    bVar3 = iVar6 < 0x41;
  }
  if ((br->eos != 0) || (!(bool)(br->pos != br->len | bVar3))) {
    br->bit_pos = 0;
    br->eos = 1;
  }
  return;
}

Assistant:

void VP8LDoFillBitWindow(VP8LBitReader* const br) {
  assert(br->bit_pos >= VP8L_WBITS);
#if defined(VP8L_USE_FAST_LOAD)
  if (br->pos + sizeof(br->val) < br->len) {
    br->val >>= VP8L_WBITS;
    br->bit_pos -= VP8L_WBITS;
    br->val |= (vp8l_val_t)HToLE32(WebPMemToUint32(br->buf + br->pos)) <<
               (VP8L_LBITS - VP8L_WBITS);
    br->pos += VP8L_LOG8_WBITS;
    return;
  }
#endif
  ShiftBytes(br);       // Slow path.
}